

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.h
# Opt level: O0

int64_t __thiscall aeron::concurrent::logbuffer::Header::position(Header *this)

{
  int32_t iVar1;
  int32_t iVar2;
  int termOffset;
  int64_t iVar3;
  int32_t resultingOffset;
  Header *this_local;
  
  iVar1 = Header::termOffset(this);
  iVar2 = frameLength(this);
  termOffset = util::BitUtil::align<int>(iVar1 + iVar2,0x20);
  iVar1 = termId(this);
  iVar3 = LogBufferDescriptor::computePosition
                    (iVar1,termOffset,this->m_positionBitsToShift,this->m_initialTermId);
  return iVar3;
}

Assistant:

inline std::int64_t position() const
    {
        const std::int32_t resultingOffset = util::BitUtil::align(termOffset() + frameLength(), FrameDescriptor::FRAME_ALIGNMENT);
        return LogBufferDescriptor::computePosition(termId(), resultingOffset, m_positionBitsToShift, m_initialTermId);
    }